

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O2

uint32_t __thiscall HvFile::createpath(HvFile *this,HKEY root,pathmap_t *pmap,string *path)

{
  uint32_t uVar1;
  iterator iVar2;
  long lVar3;
  undefined8 *puVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool>
  pVar5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  pStack_58;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::find(&pmap->_M_t,path);
  if ((_Rb_tree_header *)iVar2._M_node == &(pmap->_M_t)._M_impl.super__Rb_tree_header) {
    lVar3 = std::__cxx11::string::find_last_of((char *)path,0x126945);
    if (lVar3 == -1) {
      std::__cxx11::string::string((string *)&pStack_58,(string *)path);
      uVar1 = 0;
    }
    else {
      std::__cxx11::string::substr((ulong)&pStack_58,(ulong)path);
      uVar1 = createpath(this,root,pmap,&pStack_58.first);
      std::__cxx11::string::~string((string *)&pStack_58);
      std::__cxx11::string::substr((ulong)&pStack_58,(ulong)path);
    }
    uVar1 = allocpath(this,root,uVar1,&pStack_58.first);
    std::__cxx11::string::~string((string *)&pStack_58);
    std::__cxx11::string::string((string *)&pStack_58,(string *)path);
    pStack_58.second = uVar1;
    pVar5 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
            ::_M_insert_unique<std::pair<std::__cxx11::string_const,unsigned_int>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                        *)pmap,&pStack_58);
    iVar2._M_node = (_Base_ptr)pVar5.first._M_node;
    std::__cxx11::string::~string((string *)&pStack_58);
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = "insert failed unexpectedly";
      __cxa_throw(puVar4,&char_const*::typeinfo,0);
    }
  }
  return iVar2._M_node[2]._M_color;
}

Assistant:

uint32_t createpath(HKEY root, pathmap_t& pmap, const std::string& path)
    {
        auto p= pmap.find(path);
        if (p!=pmap.end())
            return p->second;

        size_t slash= path.find_last_of("\\");
        uint32_t parentid= slash==path.npos ? 0 : createpath(root, pmap, path.substr(0,slash));

        uint32_t id= allocpath(root, parentid, slash==path.npos ? path : path.substr(slash+1));

        auto ins= pmap.insert(pathmap_t::value_type(path, id));
        if (!ins.second)
            throw "insert failed unexpectedly";
        return ins.first->second;
    }